

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

void GetShellEscapedString(string *input,string *result)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  const_iterator end;
  const_iterator it;
  const_iterator span_begin;
  char kEscapeSequence [4];
  char kQuote;
  string *result_local;
  string *input_local;
  
  if (result != (string *)0x0) {
    bVar1 = StringNeedsShellEscaping(input);
    if (bVar1) {
      std::__cxx11::string::push_back((char)result);
      it._M_current = (char *)std::__cxx11::string::begin();
      end._M_current = (char *)std::__cxx11::string::begin();
      local_38._M_current = (char *)std::__cxx11::string::end();
      while( true ) {
        bVar1 = __gnu_cxx::operator!=(&end,&local_38);
        if (!bVar1) break;
        pcVar2 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&end);
        if (*pcVar2 == '\'') {
          std::__cxx11::string::
          append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                    ((string *)result,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )it._M_current,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )end._M_current);
          std::__cxx11::string::append((char *)result);
          it = end;
        }
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&end);
      }
      __last._M_current = (char *)std::__cxx11::string::end();
      std::__cxx11::string::
      append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)result,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )it._M_current,__last);
      std::__cxx11::string::push_back((char)result);
    }
    else {
      std::__cxx11::string::append((string *)result);
    }
    return;
  }
  __assert_fail("result",
                "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/util.cc"
                ,0x101,"void GetShellEscapedString(const string &, string *)");
}

Assistant:

void GetShellEscapedString(const string& input, string* result) {
  assert(result);

  if (!StringNeedsShellEscaping(input)) {
    result->append(input);
    return;
  }

  const char kQuote = '\'';
  const char kEscapeSequence[] = "'\\'";

  result->push_back(kQuote);

  string::const_iterator span_begin = input.begin();
  for (string::const_iterator it = input.begin(), end = input.end(); it != end;
       ++it) {
    if (*it == kQuote) {
      result->append(span_begin, it);
      result->append(kEscapeSequence);
      span_begin = it;
    }
  }
  result->append(span_begin, input.end());
  result->push_back(kQuote);
}